

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_dec_clnpass(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_INT32 cblksty)

{
  OPJ_BYTE **ppOVar1;
  OPJ_UINT32 *pOVar2;
  byte *pbVar3;
  opj_mqc_state_t **ppoVar4;
  opj_mqc_state_t **ppoVar5;
  byte bVar6;
  byte bVar7;
  OPJ_BYTE *pOVar8;
  uint uVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  uint uVar12;
  ulong uVar13;
  opj_mqc_state_t **ppoVar14;
  uint uVar15;
  uint uVar16;
  opj_mqc_state_t *poVar17;
  uint *puVar18;
  OPJ_UINT32 OVar19;
  uint uVar20;
  uint uVar21;
  OPJ_UINT32 OVar22;
  uint uVar23;
  OPJ_UINT32 OVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  opj_mqc_t *mqc;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  OPJ_UINT32 OVar32;
  OPJ_UINT32 c;
  OPJ_UINT32 OVar33;
  uint *local_88;
  uint *local_78;
  
  uVar29 = t1->w;
  uVar31 = (ulong)uVar29;
  if ((uVar31 == 0x40) && (t1->h == 0x40)) {
    puVar18 = t1->flags + 0x43;
    uVar9 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    ppOVar1 = &(t1->mqc).bp;
    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
    uVar10 = -uVar9;
    ppoVar4 = (t1->mqc).ctxs + 0x11;
    ppoVar5 = (t1->mqc).ctxs + 0x12;
    local_78 = (uint *)t1->data;
    ppoVar14 = (t1->mqc).curctx;
    OVar33 = (t1->mqc).c;
    uVar29 = (t1->mqc).a;
    OVar22 = (t1->mqc).ct;
    if ((cblksty & 8U) == 0) {
      for (uVar25 = 0; uVar25 < 0x40; uVar25 = uVar25 + 4) {
        for (iVar27 = 0; iVar27 != 0x40; iVar27 = iVar27 + 1) {
          uVar15 = *puVar18;
          uVar31 = (ulong)uVar15;
          OVar19 = 8;
          if (uVar31 == 0) {
            poVar17 = *ppoVar4;
            uVar15 = poVar17->qeval;
            uVar30 = uVar29 - uVar15;
            if (OVar33 >> 0x10 < uVar15) {
              uVar28 = poVar17->mps;
              *ppoVar4 = (&poVar17->nmps)[uVar15 <= uVar30];
              uVar29 = uVar15;
              do {
                if (OVar22 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x200;
                      OVar22 = 7;
                    }
                    else {
                      OVar33 = OVar33 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                      OVar22 = OVar19;
                    }
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar33 = OVar33 + (uint)bVar6 * 0x100;
                    OVar22 = OVar19;
                  }
                }
                uVar29 = uVar29 * 2;
                OVar33 = OVar33 * 2;
                OVar22 = OVar22 - 1;
              } while (uVar29 < 0x8000);
              uVar26 = (uint)(uVar28 == 0);
              if (uVar30 < uVar15) {
                uVar26 = uVar28;
              }
            }
            else {
              OVar33 = OVar33 + uVar15 * -0x10000;
              uVar29 = uVar30;
              if ((short)uVar30 < 0) {
                uVar26 = poVar17->mps;
              }
              else {
                uVar28 = poVar17->mps;
                *ppoVar4 = (&poVar17->nmps)[uVar30 < uVar15];
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar15 <= uVar30) {
                  uVar26 = uVar28;
                }
              }
            }
            ppoVar14 = ppoVar4;
            if (uVar26 != 0) {
              poVar17 = *ppoVar5;
              uVar15 = poVar17->qeval;
              uVar29 = uVar29 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                poVar17 = (&poVar17->nmps)[uVar15 <= uVar29];
                *ppoVar5 = poVar17;
                uVar30 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar30 = uVar30 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar30 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar29 < uVar15) {
                  uVar26 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar30 = uVar29;
                if ((short)uVar29 < 0) {
                  uVar26 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  poVar17 = (&poVar17->nmps)[uVar29 < uVar15];
                  *ppoVar5 = poVar17;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar30 = uVar30 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar30 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar29) {
                    uVar26 = uVar28;
                  }
                }
              }
              uVar15 = poVar17->qeval;
              uVar30 = uVar30 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                *ppoVar5 = (&poVar17->nmps)[uVar15 <= uVar30];
                uVar29 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar16 = (uint)(uVar28 == 0);
                if (uVar30 < uVar15) {
                  uVar16 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar29 = uVar30;
                if ((short)uVar30 < 0) {
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  *ppoVar5 = (&poVar17->nmps)[uVar30 < uVar15];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar30) {
                    uVar16 = uVar28;
                  }
                }
              }
              OVar32 = 0;
              uVar15 = 0;
              ppoVar14 = ppoVar5;
              OVar11 = 0;
              switch(uVar26 * 2 | uVar16) {
              case 0:
                uVar30 = puVar18[1] >> 0x11 & 4 | puVar18[-1] >> 0x13 & 1;
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar30];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar15 = poVar17->qeval;
                uVar29 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  uVar26 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar15 <= uVar29];
                  uVar28 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar28 = uVar28 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar28 < 0x8000);
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar29 < uVar15) {
                    uVar16 = uVar26;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar28 = uVar29;
                  if ((short)uVar29 < 0) {
                    uVar16 = poVar17->mps;
                  }
                  else {
                    uVar26 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar29 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar28 = uVar28 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar28 < 0x8000);
                    uVar16 = (uint)(uVar26 == 0);
                    if (uVar15 <= uVar29) {
                      uVar16 = uVar26;
                    }
                  }
                }
                uVar15 = uVar16 ^ ""[uVar30];
                uVar29 = uVar10;
                if (uVar16 == ""[uVar30]) {
                  uVar29 = uVar9;
                }
                *local_78 = uVar29;
                *(byte *)(puVar18 + -1) = (byte)puVar18[-1] | 0x20;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 8;
                *(ulong *)(puVar18 + -0x43) =
                     CONCAT44(uVar15 << 0x1f,0x20000) | 0x1000000000000 |
                     *(ulong *)(puVar18 + -0x43);
                *(byte *)((long)puVar18 + -0x103) = *(byte *)((long)puVar18 + -0x103) | 0x80;
                bVar6 = (t1->mqc).lut_ctxno_zc_orient[2];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar30 = poVar17->qeval;
                uVar28 = uVar28 - uVar30;
                if (OVar33 >> 0x10 < uVar30) {
                  uVar26 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar30 <= uVar28];
                  uVar29 = uVar30;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar28 < uVar30) {
                    uVar16 = uVar26;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar30 * -0x10000;
                  uVar29 = uVar28;
                  if ((short)uVar28 < 0) {
                    uVar16 = poVar17->mps;
                  }
                  else {
                    uVar26 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar28 < uVar30];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    uVar16 = (uint)(uVar26 == 0);
                    if (uVar30 <= uVar28) {
                      uVar16 = uVar26;
                    }
                  }
                }
                OVar32 = uVar15 << 0x13 | 0x10;
                if (uVar16 != 0) goto switchD_001296c0_caseD_1;
                break;
              case 1:
switchD_001296c0_caseD_1:
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(OVar32,puVar18[-1],puVar18[1],1);
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [OVar11];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar15 = poVar17->qeval;
                uVar30 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  uVar28 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar15 <= uVar30];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar30 < uVar15) {
                    uVar26 = uVar28;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar30;
                  if ((short)uVar30 < 0) {
                    uVar26 = poVar17->mps;
                  }
                  else {
                    uVar28 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar30 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    uVar26 = (uint)(uVar28 == 0);
                    if (uVar15 <= uVar30) {
                      uVar26 = uVar28;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar15 = uVar10;
                if (uVar26 == bVar6) {
                  uVar15 = uVar9;
                }
                local_78[0x40] = uVar15;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 1;
                OVar32 = OVar32 | (uVar26 ^ bVar6) << 0x16 | 0x80;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 0x40;
                break;
              case 2:
                goto switchD_001296c0_caseD_2;
              case 3:
                goto switchD_001296c0_caseD_3;
              default:
                goto switchD_001296c0_default;
              }
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[OVar32 >> 6 & 0x1ef];
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar15 = poVar17->qeval;
              uVar30 = uVar29 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar15 <= uVar30];
                uVar29 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar30 < uVar15) {
                  uVar26 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar29 = uVar30;
                if ((short)uVar30 < 0) {
                  uVar26 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar30 < uVar15];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar30) {
                    uVar26 = uVar28;
                  }
                }
              }
              uVar15 = OVar32;
              if (uVar26 != 0) {
switchD_001296c0_caseD_2:
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(OVar32,puVar18[-1],puVar18[1],2);
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [OVar11];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar15 = poVar17->qeval;
                uVar30 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  uVar28 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar15 <= uVar30];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar30 < uVar15) {
                    uVar26 = uVar28;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar30;
                  if ((short)uVar30 < 0) {
                    uVar26 = poVar17->mps;
                  }
                  else {
                    uVar28 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar30 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    uVar26 = (uint)(uVar28 == 0);
                    if (uVar15 <= uVar30) {
                      uVar26 = uVar28;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar15 = uVar10;
                if (uVar26 == bVar6) {
                  uVar15 = uVar9;
                }
                local_78[0x80] = uVar15;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 8;
                *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 2;
                uVar15 = OVar32 | (uVar26 ^ bVar6) << 0x19 | 0x400;
              }
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar15 >> 9 & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar30 = poVar17->qeval;
              uVar28 = uVar29 - uVar30;
              if (OVar33 >> 0x10 < uVar30) {
                uVar26 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                uVar29 = uVar30;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar16 = (uint)(uVar26 == 0);
                if (uVar28 < uVar30) {
                  uVar16 = uVar26;
                }
              }
              else {
                OVar33 = OVar33 + uVar30 * -0x10000;
                uVar29 = uVar28;
                if ((short)uVar28 < 0) {
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar30 <= uVar28) {
                    uVar16 = uVar26;
                  }
                }
              }
              OVar11 = uVar15;
              if (uVar16 != 0) {
switchD_001296c0_caseD_3:
                uVar15 = OVar11;
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar15,puVar18[-1],puVar18[1],3);
                uVar31 = (ulong)OVar11;
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar31];
                poVar17 = *ppoVar14;
                uVar30 = poVar17->qeval;
                uVar28 = uVar29 - uVar30;
                if (OVar33 >> 0x10 < uVar30) {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                  uVar29 = uVar30;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  goto LAB_0012a99c;
                }
                OVar33 = OVar33 + uVar30 * -0x10000;
                if ((short)uVar28 < 0) {
LAB_0012aa32:
                  uVar29 = uVar28;
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                  uVar29 = uVar28;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
LAB_0012aa3f:
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar30 <= uVar28) {
                    uVar16 = uVar26;
                  }
                }
                goto LAB_0012aa4f;
              }
              goto switchD_001296c0_default;
            }
          }
          else {
            if ((uVar15 & 0x200010) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar15 & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar30 = poVar17->qeval;
              uVar28 = uVar29 - uVar30;
              if (OVar33 >> 0x10 < uVar30) {
                uVar26 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                uVar29 = uVar30;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar16 = (uint)(uVar26 == 0);
                if (uVar28 < uVar30) {
                  uVar16 = uVar26;
                }
              }
              else {
                OVar33 = OVar33 + uVar30 * -0x10000;
                uVar29 = uVar28;
                if ((short)uVar28 < 0) {
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar30 <= uVar28) {
                    uVar16 = uVar26;
                  }
                }
              }
              if (uVar16 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar15,puVar18[-1],puVar18[1],0);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar30 = poVar17->qeval;
                uVar28 = uVar29 - uVar30;
                if (OVar33 >> 0x10 < uVar30) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                  uVar29 = uVar30;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar28 < uVar30) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar30 * -0x10000;
                  uVar29 = uVar28;
                  if ((short)uVar28 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar30 <= uVar28) {
                      OVar24 = OVar32;
                    }
                  }
                }
                uVar28 = OVar24 ^ ""[OVar11];
                uVar30 = uVar10;
                if (OVar24 == ""[OVar11]) {
                  uVar30 = uVar9;
                }
                *local_78 = uVar30;
                *(byte *)(puVar18 + -1) = (byte)puVar18[-1] | 0x20;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 8;
                *(ulong *)(puVar18 + -0x43) =
                     CONCAT44(uVar28 << 0x1f,0x20000) | 0x1000000000000 |
                     *(ulong *)(puVar18 + -0x43);
                *(byte *)((long)puVar18 + -0x103) = *(byte *)((long)puVar18 + -0x103) | 0x80;
                uVar31 = (ulong)(uVar28 << 0x13 | uVar15 | 0x10);
              }
            }
            if ((uVar31 & 0x1000080) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar31 >> 3) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar15 = poVar17->qeval;
              uVar30 = uVar29 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar15 <= uVar30];
                uVar29 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar30 < uVar15) {
                  uVar26 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar29 = uVar30;
                if ((short)uVar30 < 0) {
                  uVar26 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar30 < uVar15];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar30) {
                    uVar26 = uVar28;
                  }
                }
              }
              if (uVar26 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index((uint)uVar31,puVar18[-1],puVar18[1],1);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar15 = poVar17->qeval;
                uVar30 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar15 <= uVar30];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar30 < uVar15) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar30;
                  if ((short)uVar30 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar30 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar15 <= uVar30) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar15 = uVar10;
                if (OVar24 == bVar6) {
                  uVar15 = uVar9;
                }
                local_78[0x40] = uVar15;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 1;
                uVar31 = (ulong)((uint)uVar31 | (OVar24 ^ bVar6) << 0x16 | 0x80);
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 0x40;
              }
            }
            if ((uVar31 & 0x8000400) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar31 >> 6) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar15 = poVar17->qeval;
              uVar30 = uVar29 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar15 <= uVar30];
                uVar29 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar30 < uVar15) {
                  uVar26 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar29 = uVar30;
                if ((short)uVar30 < 0) {
                  uVar26 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar30 < uVar15];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar30) {
                    uVar26 = uVar28;
                  }
                }
              }
              if (uVar26 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index((uint)uVar31,puVar18[-1],puVar18[1],2);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar15 = poVar17->qeval;
                uVar30 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar15 <= uVar30];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar30 < uVar15) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar30;
                  if ((short)uVar30 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar30 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar15 <= uVar30) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar15 = uVar10;
                if (OVar24 == bVar6) {
                  uVar15 = uVar9;
                }
                local_78[0x80] = uVar15;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 8;
                uVar31 = (ulong)((uint)uVar31 | (OVar24 ^ bVar6) << 0x19 | 0x400);
                *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 2;
              }
            }
            uVar15 = (uint)uVar31;
            if ((uVar31 & 0x40002000) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar31 >> 9) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar30 = poVar17->qeval;
              uVar28 = uVar29 - uVar30;
              if (OVar33 >> 0x10 < uVar30) {
                uVar26 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                uVar29 = uVar30;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar16 = (uint)(uVar26 == 0);
                if (uVar28 < uVar30) {
                  uVar16 = uVar26;
                }
              }
              else {
                OVar33 = OVar33 + uVar30 * -0x10000;
                uVar29 = uVar28;
                if ((short)uVar28 < 0) {
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar30 <= uVar28) {
                    uVar16 = uVar26;
                  }
                }
              }
              if (uVar16 == 0) goto switchD_001296c0_default;
              OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar15,puVar18[-1],puVar18[1],3);
              uVar31 = (ulong)OVar11;
              ppoVar14 = (t1->mqc).ctxs +
                         "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                         [uVar31];
              poVar17 = *ppoVar14;
              uVar30 = poVar17->qeval;
              uVar28 = uVar29 - uVar30;
              if (uVar30 <= OVar33 >> 0x10) {
                OVar33 = OVar33 + uVar30 * -0x10000;
                if ((short)uVar28 < 0) goto LAB_0012aa32;
                uVar26 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                uVar29 = uVar28;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                goto LAB_0012aa3f;
              }
              uVar26 = poVar17->mps;
              *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
              uVar29 = uVar30;
              do {
                if (OVar22 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x200;
                      OVar22 = 7;
                    }
                    else {
                      OVar33 = OVar33 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                      OVar22 = OVar19;
                    }
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar33 = OVar33 + (uint)bVar6 * 0x100;
                    OVar22 = OVar19;
                  }
                }
                uVar29 = uVar29 * 2;
                OVar33 = OVar33 * 2;
                OVar22 = OVar22 - 1;
              } while (uVar29 < 0x8000);
LAB_0012a99c:
              uVar16 = (uint)(uVar26 == 0);
              if (uVar28 < uVar30) {
                uVar16 = uVar26;
              }
LAB_0012aa4f:
              uVar28 = uVar16 ^ ""[uVar31];
              uVar30 = uVar10;
              if (uVar16 == ""[uVar31]) {
                uVar30 = uVar9;
              }
              local_78[0xc0] = uVar30;
              *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 0x40;
              *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 0x10;
              *(ulong *)(puVar18 + 0x41) =
                   CONCAT44(uVar28 << 0x12,4) | 0x200000000 | *(ulong *)(puVar18 + 0x41);
              *(byte *)(puVar18 + 0x43) = (byte)puVar18[0x43] | 1;
              uVar15 = uVar28 << 0x1c | uVar15 | 0x2000;
            }
switchD_001296c0_default:
            *puVar18 = uVar15 & 0xb6dfffff;
          }
          local_78 = local_78 + 1;
          puVar18 = puVar18 + 1;
        }
        local_78 = local_78 + 0xc0;
        puVar18 = puVar18 + 2;
      }
    }
    else {
      for (uVar25 = 0; uVar25 < 0x40; uVar25 = uVar25 + 4) {
        for (iVar27 = 0; iVar27 != 0x40; iVar27 = iVar27 + 1) {
          uVar15 = *puVar18;
          uVar31 = (ulong)uVar15;
          OVar19 = 8;
          if (uVar31 == 0) {
            poVar17 = *ppoVar4;
            uVar15 = poVar17->qeval;
            uVar30 = uVar29 - uVar15;
            if (OVar33 >> 0x10 < uVar15) {
              uVar28 = poVar17->mps;
              *ppoVar4 = (&poVar17->nmps)[uVar15 <= uVar30];
              uVar29 = uVar15;
              do {
                if (OVar22 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x200;
                      OVar22 = 7;
                    }
                    else {
                      OVar33 = OVar33 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                      OVar22 = OVar19;
                    }
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar33 = OVar33 + (uint)bVar6 * 0x100;
                    OVar22 = OVar19;
                  }
                }
                uVar29 = uVar29 * 2;
                OVar33 = OVar33 * 2;
                OVar22 = OVar22 - 1;
              } while (uVar29 < 0x8000);
              uVar26 = (uint)(uVar28 == 0);
              if (uVar30 < uVar15) {
                uVar26 = uVar28;
              }
            }
            else {
              OVar33 = OVar33 + uVar15 * -0x10000;
              uVar29 = uVar30;
              if ((short)uVar30 < 0) {
                uVar26 = poVar17->mps;
              }
              else {
                uVar28 = poVar17->mps;
                *ppoVar4 = (&poVar17->nmps)[uVar30 < uVar15];
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar15 <= uVar30) {
                  uVar26 = uVar28;
                }
              }
            }
            ppoVar14 = ppoVar4;
            if (uVar26 != 0) {
              poVar17 = *ppoVar5;
              uVar15 = poVar17->qeval;
              uVar29 = uVar29 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                poVar17 = (&poVar17->nmps)[uVar15 <= uVar29];
                *ppoVar5 = poVar17;
                uVar30 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar30 = uVar30 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar30 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar29 < uVar15) {
                  uVar26 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar30 = uVar29;
                if ((short)uVar29 < 0) {
                  uVar26 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  poVar17 = (&poVar17->nmps)[uVar29 < uVar15];
                  *ppoVar5 = poVar17;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar30 = uVar30 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar30 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar29) {
                    uVar26 = uVar28;
                  }
                }
              }
              uVar15 = poVar17->qeval;
              uVar30 = uVar30 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                *ppoVar5 = (&poVar17->nmps)[uVar15 <= uVar30];
                uVar29 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar16 = (uint)(uVar28 == 0);
                if (uVar30 < uVar15) {
                  uVar16 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar29 = uVar30;
                if ((short)uVar30 < 0) {
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  *ppoVar5 = (&poVar17->nmps)[uVar30 < uVar15];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar30) {
                    uVar16 = uVar28;
                  }
                }
              }
              OVar32 = 0;
              uVar15 = 0;
              ppoVar14 = ppoVar5;
              OVar11 = 0;
              switch(uVar26 * 2 | uVar16) {
              case 0:
                uVar30 = puVar18[1] >> 0x11 & 4 | puVar18[-1] >> 0x13 & 1;
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar30];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar15 = poVar17->qeval;
                uVar29 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  OVar11 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar15 <= uVar29];
                  uVar28 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar28 = uVar28 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar28 < 0x8000);
                  OVar32 = (uint)(OVar11 == 0);
                  if (uVar29 < uVar15) {
                    OVar32 = OVar11;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar28 = uVar29;
                  if ((short)uVar29 < 0) {
                    OVar32 = poVar17->mps;
                  }
                  else {
                    OVar11 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar29 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar28 = uVar28 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar28 < 0x8000);
                    OVar32 = (uint)(OVar11 == 0);
                    if (uVar15 <= uVar29) {
                      OVar32 = OVar11;
                    }
                  }
                }
                bVar6 = ""[uVar30];
                uVar29 = uVar10;
                if (OVar32 == bVar6) {
                  uVar29 = uVar9;
                }
                *local_78 = uVar29;
                *(byte *)(puVar18 + -1) = (byte)puVar18[-1] | 0x20;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 8;
                bVar7 = (t1->mqc).lut_ctxno_zc_orient[2];
                poVar17 = (t1->mqc).ctxs[bVar7];
                uVar15 = poVar17->qeval;
                uVar28 = uVar28 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  uVar30 = poVar17->mps;
                  (t1->mqc).ctxs[bVar7] = (&poVar17->nmps)[uVar15 <= uVar28];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar7 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar7 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar7 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar7 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar30 == 0);
                  if (uVar28 < uVar15) {
                    uVar26 = uVar30;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar28;
                  if ((short)uVar28 < 0) {
                    uVar26 = poVar17->mps;
                  }
                  else {
                    uVar30 = poVar17->mps;
                    (t1->mqc).ctxs[bVar7] = (&poVar17->nmps)[uVar28 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar7 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar7 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar7 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar7 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    uVar26 = (uint)(uVar30 == 0);
                    if (uVar15 <= uVar28) {
                      uVar26 = uVar30;
                    }
                  }
                }
                OVar32 = (OVar32 ^ bVar6) << 0x13 | 0x10;
                if (uVar26 != 0) goto switchD_0012ea9e_caseD_1;
                break;
              case 1:
switchD_0012ea9e_caseD_1:
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(OVar32,puVar18[-1],puVar18[1],1);
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [OVar11];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar15 = poVar17->qeval;
                uVar30 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  uVar28 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar15 <= uVar30];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar30 < uVar15) {
                    uVar26 = uVar28;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar30;
                  if ((short)uVar30 < 0) {
                    uVar26 = poVar17->mps;
                  }
                  else {
                    uVar28 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar30 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    uVar26 = (uint)(uVar28 == 0);
                    if (uVar15 <= uVar30) {
                      uVar26 = uVar28;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar15 = uVar10;
                if (uVar26 == bVar6) {
                  uVar15 = uVar9;
                }
                local_78[0x40] = uVar15;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 1;
                OVar32 = OVar32 | (uVar26 ^ bVar6) << 0x16 | 0x80;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 0x40;
                break;
              case 2:
                goto switchD_0012ea9e_caseD_2;
              case 3:
                goto switchD_0012ea9e_caseD_3;
              default:
                goto switchD_0012ea9e_default;
              }
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[OVar32 >> 6 & 0x1ef];
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar15 = poVar17->qeval;
              uVar30 = uVar29 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar15 <= uVar30];
                uVar29 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar30 < uVar15) {
                  uVar26 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar29 = uVar30;
                if ((short)uVar30 < 0) {
                  uVar26 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar30 < uVar15];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar30) {
                    uVar26 = uVar28;
                  }
                }
              }
              uVar15 = OVar32;
              if (uVar26 != 0) {
switchD_0012ea9e_caseD_2:
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(OVar32,puVar18[-1],puVar18[1],2);
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [OVar11];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar15 = poVar17->qeval;
                uVar30 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  uVar28 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar15 <= uVar30];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar30 < uVar15) {
                    uVar26 = uVar28;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar30;
                  if ((short)uVar30 < 0) {
                    uVar26 = poVar17->mps;
                  }
                  else {
                    uVar28 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar30 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    uVar26 = (uint)(uVar28 == 0);
                    if (uVar15 <= uVar30) {
                      uVar26 = uVar28;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar15 = uVar10;
                if (uVar26 == bVar6) {
                  uVar15 = uVar9;
                }
                local_78[0x80] = uVar15;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 8;
                *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 2;
                uVar15 = OVar32 | (uVar26 ^ bVar6) << 0x19 | 0x400;
              }
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar15 >> 9 & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar30 = poVar17->qeval;
              uVar28 = uVar29 - uVar30;
              if (OVar33 >> 0x10 < uVar30) {
                uVar26 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                uVar29 = uVar30;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar16 = (uint)(uVar26 == 0);
                if (uVar28 < uVar30) {
                  uVar16 = uVar26;
                }
              }
              else {
                OVar33 = OVar33 + uVar30 * -0x10000;
                uVar29 = uVar28;
                if ((short)uVar28 < 0) {
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar30 <= uVar28) {
                    uVar16 = uVar26;
                  }
                }
              }
              OVar11 = uVar15;
              if (uVar16 != 0) {
switchD_0012ea9e_caseD_3:
                uVar15 = OVar11;
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar15,puVar18[-1],puVar18[1],3);
                uVar31 = (ulong)OVar11;
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar31];
                poVar17 = *ppoVar14;
                uVar30 = poVar17->qeval;
                uVar28 = uVar29 - uVar30;
                if (OVar33 >> 0x10 < uVar30) {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                  uVar29 = uVar30;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  goto LAB_0012fd10;
                }
                OVar33 = OVar33 + uVar30 * -0x10000;
                if ((short)uVar28 < 0) {
LAB_0012fda6:
                  uVar29 = uVar28;
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                  uVar29 = uVar28;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
LAB_0012fdb3:
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar30 <= uVar28) {
                    uVar16 = uVar26;
                  }
                }
                goto LAB_0012fdc3;
              }
              goto switchD_0012ea9e_default;
            }
          }
          else {
            if ((uVar15 & 0x200010) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar15 & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar30 = poVar17->qeval;
              uVar28 = uVar29 - uVar30;
              if (OVar33 >> 0x10 < uVar30) {
                uVar26 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                uVar29 = uVar30;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar16 = (uint)(uVar26 == 0);
                if (uVar28 < uVar30) {
                  uVar16 = uVar26;
                }
              }
              else {
                OVar33 = OVar33 + uVar30 * -0x10000;
                uVar29 = uVar28;
                if ((short)uVar28 < 0) {
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar30 <= uVar28) {
                    uVar16 = uVar26;
                  }
                }
              }
              if (uVar16 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar15,puVar18[-1],puVar18[1],0);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar30 = poVar17->qeval;
                uVar28 = uVar29 - uVar30;
                if (OVar33 >> 0x10 < uVar30) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                  uVar29 = uVar30;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar28 < uVar30) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar30 * -0x10000;
                  uVar29 = uVar28;
                  if ((short)uVar28 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar30 <= uVar28) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar30 = uVar10;
                if (OVar24 == bVar6) {
                  uVar30 = uVar9;
                }
                *local_78 = uVar30;
                *(byte *)(puVar18 + -1) = (byte)puVar18[-1] | 0x20;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 8;
                uVar31 = (ulong)((OVar24 ^ bVar6) << 0x13 | uVar15 | 0x10);
              }
            }
            if ((uVar31 & 0x1000080) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar31 >> 3) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar15 = poVar17->qeval;
              uVar30 = uVar29 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar15 <= uVar30];
                uVar29 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar30 < uVar15) {
                  uVar26 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar29 = uVar30;
                if ((short)uVar30 < 0) {
                  uVar26 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar30 < uVar15];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar30) {
                    uVar26 = uVar28;
                  }
                }
              }
              if (uVar26 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index((uint)uVar31,puVar18[-1],puVar18[1],1);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar15 = poVar17->qeval;
                uVar30 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar15 <= uVar30];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar30 < uVar15) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar30;
                  if ((short)uVar30 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar30 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar15 <= uVar30) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar15 = uVar10;
                if (OVar24 == bVar6) {
                  uVar15 = uVar9;
                }
                local_78[0x40] = uVar15;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 1;
                uVar31 = (ulong)((uint)uVar31 | (OVar24 ^ bVar6) << 0x16 | 0x80);
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 0x40;
              }
            }
            if ((uVar31 & 0x8000400) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar31 >> 6) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar15 = poVar17->qeval;
              uVar30 = uVar29 - uVar15;
              if (OVar33 >> 0x10 < uVar15) {
                uVar28 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar15 <= uVar30];
                uVar29 = uVar15;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar26 = (uint)(uVar28 == 0);
                if (uVar30 < uVar15) {
                  uVar26 = uVar28;
                }
              }
              else {
                OVar33 = OVar33 + uVar15 * -0x10000;
                uVar29 = uVar30;
                if ((short)uVar30 < 0) {
                  uVar26 = poVar17->mps;
                }
                else {
                  uVar28 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar30 < uVar15];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar26 = (uint)(uVar28 == 0);
                  if (uVar15 <= uVar30) {
                    uVar26 = uVar28;
                  }
                }
              }
              if (uVar26 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index((uint)uVar31,puVar18[-1],puVar18[1],2);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar15 = poVar17->qeval;
                uVar30 = uVar29 - uVar15;
                if (OVar33 >> 0x10 < uVar15) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar15 <= uVar30];
                  uVar29 = uVar15;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar30 < uVar15) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar15 * -0x10000;
                  uVar29 = uVar30;
                  if ((short)uVar30 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar30 < uVar15];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar29 = uVar29 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar29 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar15 <= uVar30) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar15 = uVar10;
                if (OVar24 == bVar6) {
                  uVar15 = uVar9;
                }
                local_78[0x80] = uVar15;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 8;
                uVar31 = (ulong)((uint)uVar31 | (OVar24 ^ bVar6) << 0x19 | 0x400);
                *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 2;
              }
            }
            uVar15 = (uint)uVar31;
            if ((uVar31 & 0x40002000) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar31 >> 9) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar30 = poVar17->qeval;
              uVar28 = uVar29 - uVar30;
              if (OVar33 >> 0x10 < uVar30) {
                uVar26 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
                uVar29 = uVar30;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                uVar16 = (uint)(uVar26 == 0);
                if (uVar28 < uVar30) {
                  uVar16 = uVar26;
                }
              }
              else {
                OVar33 = OVar33 + uVar30 * -0x10000;
                uVar29 = uVar28;
                if ((short)uVar28 < 0) {
                  uVar16 = poVar17->mps;
                }
                else {
                  uVar26 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar29 = uVar29 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar29 < 0x8000);
                  uVar16 = (uint)(uVar26 == 0);
                  if (uVar30 <= uVar28) {
                    uVar16 = uVar26;
                  }
                }
              }
              if (uVar16 == 0) goto switchD_0012ea9e_default;
              OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar15,puVar18[-1],puVar18[1],3);
              uVar31 = (ulong)OVar11;
              ppoVar14 = (t1->mqc).ctxs +
                         "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                         [uVar31];
              poVar17 = *ppoVar14;
              uVar30 = poVar17->qeval;
              uVar28 = uVar29 - uVar30;
              if (uVar30 <= OVar33 >> 0x10) {
                OVar33 = OVar33 + uVar30 * -0x10000;
                if ((short)uVar28 < 0) goto LAB_0012fda6;
                uVar26 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar28 < uVar30];
                uVar29 = uVar28;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar29 = uVar29 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar29 < 0x8000);
                goto LAB_0012fdb3;
              }
              uVar26 = poVar17->mps;
              *ppoVar14 = (&poVar17->nmps)[uVar30 <= uVar28];
              uVar29 = uVar30;
              do {
                if (OVar22 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x200;
                      OVar22 = 7;
                    }
                    else {
                      OVar33 = OVar33 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                      OVar22 = OVar19;
                    }
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar33 = OVar33 + (uint)bVar6 * 0x100;
                    OVar22 = OVar19;
                  }
                }
                uVar29 = uVar29 * 2;
                OVar33 = OVar33 * 2;
                OVar22 = OVar22 - 1;
              } while (uVar29 < 0x8000);
LAB_0012fd10:
              uVar16 = (uint)(uVar26 == 0);
              if (uVar28 < uVar30) {
                uVar16 = uVar26;
              }
LAB_0012fdc3:
              uVar28 = uVar16 ^ ""[uVar31];
              uVar30 = uVar10;
              if (uVar16 == ""[uVar31]) {
                uVar30 = uVar9;
              }
              local_78[0xc0] = uVar30;
              *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 0x40;
              *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 0x10;
              *(ulong *)(puVar18 + 0x41) =
                   CONCAT44(uVar28 << 0x12,4) | 0x200000000 | *(ulong *)(puVar18 + 0x41);
              *(byte *)(puVar18 + 0x43) = (byte)puVar18[0x43] | 1;
              uVar15 = uVar28 << 0x1c | uVar15 | 0x2000;
            }
switchD_0012ea9e_default:
            *puVar18 = uVar15 & 0xb6dfffff;
          }
          local_78 = local_78 + 1;
          puVar18 = puVar18 + 1;
        }
        local_78 = local_78 + 0xc0;
        puVar18 = puVar18 + 2;
      }
    }
    (t1->mqc).curctx = ppoVar14;
    (t1->mqc).c = OVar33;
    (t1->mqc).a = uVar29;
    (t1->mqc).ct = OVar22;
  }
  else {
    puVar18 = t1->flags + (uVar29 + 3);
    uVar15 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    ppOVar1 = &(t1->mqc).bp;
    pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
    uVar30 = -uVar15;
    uVar25 = uVar29 * 2;
    ppoVar4 = (t1->mqc).ctxs + 0x11;
    ppoVar5 = (t1->mqc).ctxs + 0x12;
    local_88 = (uint *)t1->data;
    ppoVar14 = (t1->mqc).curctx;
    OVar33 = (t1->mqc).c;
    uVar9 = (t1->mqc).a;
    OVar22 = (t1->mqc).ct;
    uVar10 = uVar29 * 3;
    if ((cblksty & 8U) == 0) {
      for (uVar28 = 0; uVar26 = t1->h, uVar28 < (uVar26 & 0xfffffffc); uVar28 = uVar28 + 4) {
        for (uVar26 = 0; uVar26 != uVar29; uVar26 = uVar26 + 1) {
          uVar16 = *puVar18;
          uVar13 = (ulong)uVar16;
          OVar19 = 8;
          if (uVar13 == 0) {
            poVar17 = *ppoVar4;
            uVar16 = poVar17->qeval;
            uVar21 = uVar9 - uVar16;
            if (OVar33 >> 0x10 < uVar16) {
              uVar20 = poVar17->mps;
              *ppoVar4 = (&poVar17->nmps)[uVar16 <= uVar21];
              uVar9 = uVar16;
              do {
                if (OVar22 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x200;
                      OVar22 = 7;
                    }
                    else {
                      OVar33 = OVar33 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                      OVar22 = OVar19;
                    }
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar33 = OVar33 + (uint)bVar6 * 0x100;
                    OVar22 = OVar19;
                  }
                }
                uVar9 = uVar9 * 2;
                OVar33 = OVar33 * 2;
                OVar22 = OVar22 - 1;
              } while (uVar9 < 0x8000);
              uVar12 = (uint)(uVar20 == 0);
              if (uVar21 < uVar16) {
                uVar12 = uVar20;
              }
            }
            else {
              OVar33 = OVar33 + uVar16 * -0x10000;
              uVar9 = uVar21;
              if ((short)uVar21 < 0) {
                uVar12 = poVar17->mps;
              }
              else {
                uVar20 = poVar17->mps;
                *ppoVar4 = (&poVar17->nmps)[uVar21 < uVar16];
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar16 <= uVar21) {
                  uVar12 = uVar20;
                }
              }
            }
            ppoVar14 = ppoVar4;
            if (uVar12 != 0) {
              poVar17 = *ppoVar5;
              uVar16 = poVar17->qeval;
              uVar9 = uVar9 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                poVar17 = (&poVar17->nmps)[uVar16 <= uVar9];
                *ppoVar5 = poVar17;
                uVar21 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar21 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar9 < uVar16) {
                  uVar12 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar21 = uVar9;
                if ((short)uVar9 < 0) {
                  uVar12 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  poVar17 = (&poVar17->nmps)[uVar9 < uVar16];
                  *ppoVar5 = poVar17;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar21 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar9) {
                    uVar12 = uVar20;
                  }
                }
              }
              uVar16 = poVar17->qeval;
              uVar21 = uVar21 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                *ppoVar5 = (&poVar17->nmps)[uVar16 <= uVar21];
                uVar9 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar20 == 0);
                if (uVar21 < uVar16) {
                  uVar23 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar9 = uVar21;
                if ((short)uVar21 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  *ppoVar5 = (&poVar17->nmps)[uVar21 < uVar16];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar21) {
                    uVar23 = uVar20;
                  }
                }
              }
              uVar16 = 0;
              ppoVar14 = ppoVar5;
              OVar11 = 0;
              switch(uVar12 * 2 | uVar23) {
              case 0:
                uVar21 = puVar18[1] >> 0x11 & 4 | puVar18[-1] >> 0x13 & 1;
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar21];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar16 = poVar17->qeval;
                uVar9 = uVar9 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  uVar12 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar16 <= uVar9];
                  uVar20 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar20 = uVar20 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar20 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar9 < uVar16) {
                    uVar23 = uVar12;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar20 = uVar9;
                  if ((short)uVar9 < 0) {
                    uVar23 = poVar17->mps;
                  }
                  else {
                    uVar12 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar9 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar20 = uVar20 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar20 < 0x8000);
                    uVar23 = (uint)(uVar12 == 0);
                    if (uVar16 <= uVar9) {
                      uVar23 = uVar12;
                    }
                  }
                }
                uVar16 = uVar23 ^ ""[uVar21];
                uVar9 = uVar30;
                if (uVar23 == ""[uVar21]) {
                  uVar9 = uVar15;
                }
                *local_88 = uVar9;
                *(byte *)(puVar18 + -1) = (byte)puVar18[-1] | 0x20;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 8;
                uVar13 = (ulong)(t1->w + 2);
                *(ulong *)(puVar18 + (-1 - uVar13)) =
                     CONCAT44(uVar16 << 0x1f,0x20000) | 0x1000000000000 |
                     *(ulong *)(puVar18 + (-1 - uVar13));
                pbVar3 = (byte *)((long)puVar18 + uVar13 * -4 + 5);
                *pbVar3 = *pbVar3 | 0x80;
                bVar6 = (t1->mqc).lut_ctxno_zc_orient[2];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar21 = poVar17->qeval;
                uVar20 = uVar20 - uVar21;
                if (OVar33 >> 0x10 < uVar21) {
                  uVar12 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar21 <= uVar20];
                  uVar9 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar20 < uVar21) {
                    uVar23 = uVar12;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar21 * -0x10000;
                  uVar9 = uVar20;
                  if ((short)uVar20 < 0) {
                    uVar23 = poVar17->mps;
                  }
                  else {
                    uVar12 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar20 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    uVar23 = (uint)(uVar12 == 0);
                    if (uVar21 <= uVar20) {
                      uVar23 = uVar12;
                    }
                  }
                }
                uVar16 = uVar16 << 0x13 | 0x10;
                if (uVar23 != 0) goto switchD_0012b293_caseD_1;
                break;
              case 1:
switchD_0012b293_caseD_1:
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar16,puVar18[-1],puVar18[1],1);
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [OVar11];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar21 = poVar17->qeval;
                uVar20 = uVar9 - uVar21;
                if (OVar33 >> 0x10 < uVar21) {
                  uVar12 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar21 <= uVar20];
                  uVar9 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar20 < uVar21) {
                    uVar23 = uVar12;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar21 * -0x10000;
                  uVar9 = uVar20;
                  if ((short)uVar20 < 0) {
                    uVar23 = poVar17->mps;
                  }
                  else {
                    uVar12 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar20 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    uVar23 = (uint)(uVar12 == 0);
                    if (uVar21 <= uVar20) {
                      uVar23 = uVar12;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar21 = uVar30;
                if (uVar23 == bVar6) {
                  uVar21 = uVar15;
                }
                local_88[uVar31] = uVar21;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 1;
                uVar16 = uVar16 | (uVar23 ^ bVar6) << 0x16 | 0x80;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 0x40;
                break;
              case 2:
                goto switchD_0012b293_caseD_2;
              case 3:
                goto switchD_0012b293_caseD_3;
              default:
                goto switchD_0012b293_default;
              }
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar16 >> 6 & 0x1ef];
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (OVar33 >> 0x10 < uVar21) {
                uVar12 = poVar17->mps;
                (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar21 <= uVar20];
                uVar9 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar12 == 0);
                if (uVar20 < uVar21) {
                  uVar23 = uVar12;
                }
              }
              else {
                OVar33 = OVar33 + uVar21 * -0x10000;
                uVar9 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar20 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
              }
              if (uVar23 != 0) {
switchD_0012b293_caseD_2:
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar16,puVar18[-1],puVar18[1],2);
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [OVar11];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar21 = poVar17->qeval;
                uVar20 = uVar9 - uVar21;
                if (OVar33 >> 0x10 < uVar21) {
                  uVar12 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar21 <= uVar20];
                  uVar9 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar20 < uVar21) {
                    uVar23 = uVar12;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar21 * -0x10000;
                  uVar9 = uVar20;
                  if ((short)uVar20 < 0) {
                    uVar23 = poVar17->mps;
                  }
                  else {
                    uVar12 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar20 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    uVar23 = (uint)(uVar12 == 0);
                    if (uVar21 <= uVar20) {
                      uVar23 = uVar12;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar21 = uVar30;
                if (uVar23 == bVar6) {
                  uVar21 = uVar15;
                }
                local_88[uVar25] = uVar21;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 8;
                uVar16 = uVar16 | (uVar23 ^ bVar6) << 0x19 | 0x400;
                *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 2;
              }
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar16 >> 9 & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (OVar33 >> 0x10 < uVar21) {
                uVar12 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                uVar9 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar12 == 0);
                if (uVar20 < uVar21) {
                  uVar23 = uVar12;
                }
              }
              else {
                OVar33 = OVar33 + uVar21 * -0x10000;
                uVar9 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
              }
              OVar11 = uVar16;
              if (uVar23 != 0) {
switchD_0012b293_caseD_3:
                uVar16 = OVar11;
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar16,puVar18[-1],puVar18[1],3);
                uVar13 = (ulong)OVar11;
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar13];
                poVar17 = *ppoVar14;
                uVar21 = poVar17->qeval;
                uVar20 = uVar9 - uVar21;
                if (OVar33 >> 0x10 < uVar21) {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                  uVar9 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  goto LAB_0012c5f4;
                }
                OVar33 = OVar33 + uVar21 * -0x10000;
                if ((short)uVar20 < 0) {
LAB_0012c68d:
                  uVar9 = uVar20;
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                  uVar9 = uVar20;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
LAB_0012c699:
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
                goto LAB_0012c6a8;
              }
              goto switchD_0012b293_default;
            }
          }
          else {
            if ((uVar16 & 0x200010) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar16 & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (OVar33 >> 0x10 < uVar21) {
                uVar12 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                uVar9 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar12 == 0);
                if (uVar20 < uVar21) {
                  uVar23 = uVar12;
                }
              }
              else {
                OVar33 = OVar33 + uVar21 * -0x10000;
                uVar9 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
              }
              if (uVar23 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar16,puVar18[-1],puVar18[1],0);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar21 = poVar17->qeval;
                uVar20 = uVar9 - uVar21;
                if (OVar33 >> 0x10 < uVar21) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                  uVar9 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar20 < uVar21) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar21 * -0x10000;
                  uVar9 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar21 <= uVar20) {
                      OVar24 = OVar32;
                    }
                  }
                }
                uVar20 = OVar24 ^ ""[OVar11];
                uVar21 = uVar30;
                if (OVar24 == ""[OVar11]) {
                  uVar21 = uVar15;
                }
                *local_88 = uVar21;
                *(byte *)(puVar18 + -1) = (byte)puVar18[-1] | 0x20;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 8;
                uVar13 = (ulong)(t1->w + 2);
                *(ulong *)(puVar18 + (-1 - uVar13)) =
                     CONCAT44(uVar20 << 0x1f,0x20000) | 0x1000000000000 |
                     *(ulong *)(puVar18 + (-1 - uVar13));
                pbVar3 = (byte *)((long)puVar18 + uVar13 * -4 + 5);
                *pbVar3 = *pbVar3 | 0x80;
                uVar13 = (ulong)(uVar20 << 0x13 | uVar16 | 0x10);
              }
            }
            if ((uVar13 & 0x1000080) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 3) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar16 = poVar17->qeval;
              uVar21 = uVar9 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar16 <= uVar21];
                uVar9 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar21 < uVar16) {
                  uVar12 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar9 = uVar21;
                if ((short)uVar21 < 0) {
                  uVar12 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar21 < uVar16];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar21) {
                    uVar12 = uVar20;
                  }
                }
              }
              if (uVar12 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index((uint)uVar13,puVar18[-1],puVar18[1],1);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar16 = poVar17->qeval;
                uVar21 = uVar9 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar16 <= uVar21];
                  uVar9 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar21 < uVar16) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar9 = uVar21;
                  if ((short)uVar21 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar21 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar16 <= uVar21) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar16 = uVar30;
                if (OVar24 == bVar6) {
                  uVar16 = uVar15;
                }
                local_88[uVar31] = uVar16;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 1;
                uVar13 = (ulong)((uint)uVar13 | (OVar24 ^ bVar6) << 0x16 | 0x80);
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 0x40;
              }
            }
            if ((uVar13 & 0x8000400) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 6) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar16 = poVar17->qeval;
              uVar21 = uVar9 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar16 <= uVar21];
                uVar9 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar21 < uVar16) {
                  uVar12 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar9 = uVar21;
                if ((short)uVar21 < 0) {
                  uVar12 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar21 < uVar16];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar21) {
                    uVar12 = uVar20;
                  }
                }
              }
              if (uVar12 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index((uint)uVar13,puVar18[-1],puVar18[1],2);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar16 = poVar17->qeval;
                uVar21 = uVar9 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar16 <= uVar21];
                  uVar9 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar21 < uVar16) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar9 = uVar21;
                  if ((short)uVar21 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar21 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar16 <= uVar21) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar16 = uVar30;
                if (OVar24 == bVar6) {
                  uVar16 = uVar15;
                }
                local_88[uVar25] = uVar16;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 8;
                uVar13 = (ulong)((uint)uVar13 | (OVar24 ^ bVar6) << 0x19 | 0x400);
                *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 2;
              }
            }
            uVar16 = (uint)uVar13;
            if ((uVar13 & 0x40002000) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 9) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (OVar33 >> 0x10 < uVar21) {
                uVar12 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                uVar9 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar12 == 0);
                if (uVar20 < uVar21) {
                  uVar23 = uVar12;
                }
              }
              else {
                OVar33 = OVar33 + uVar21 * -0x10000;
                uVar9 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
              }
              if (uVar23 == 0) goto switchD_0012b293_default;
              OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar16,puVar18[-1],puVar18[1],3);
              uVar13 = (ulong)OVar11;
              ppoVar14 = (t1->mqc).ctxs +
                         "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                         [uVar13];
              poVar17 = *ppoVar14;
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (uVar21 <= OVar33 >> 0x10) {
                OVar33 = OVar33 + uVar21 * -0x10000;
                if ((short)uVar20 < 0) goto LAB_0012c68d;
                uVar12 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                uVar9 = uVar20;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                goto LAB_0012c699;
              }
              uVar12 = poVar17->mps;
              *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
              uVar9 = uVar21;
              do {
                if (OVar22 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x200;
                      OVar22 = 7;
                    }
                    else {
                      OVar33 = OVar33 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                      OVar22 = OVar19;
                    }
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar33 = OVar33 + (uint)bVar6 * 0x100;
                    OVar22 = OVar19;
                  }
                }
                uVar9 = uVar9 * 2;
                OVar33 = OVar33 * 2;
                OVar22 = OVar22 - 1;
              } while (uVar9 < 0x8000);
LAB_0012c5f4:
              uVar23 = (uint)(uVar12 == 0);
              if (uVar20 < uVar21) {
                uVar23 = uVar12;
              }
LAB_0012c6a8:
              uVar20 = uVar23 ^ ""[uVar13];
              uVar21 = uVar30;
              if (uVar23 == ""[uVar13]) {
                uVar21 = uVar15;
              }
              local_88[uVar10] = uVar21;
              *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 0x40;
              *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 0x10;
              uVar13 = (ulong)(t1->w + 2);
              *(ulong *)(puVar18 + (uVar13 - 1)) =
                   CONCAT44(uVar20 << 0x12,4) | 0x200000000 | *(ulong *)(puVar18 + (uVar13 - 1));
              *(byte *)(puVar18 + uVar13 + 1) = (byte)puVar18[uVar13 + 1] | 1;
              uVar16 = uVar20 << 0x1c | uVar16 | 0x2000;
            }
switchD_0012b293_default:
            *puVar18 = uVar16 & 0xb6dfffff;
          }
          local_88 = local_88 + 1;
          puVar18 = puVar18 + 1;
        }
        local_88 = local_88 + uVar10;
        puVar18 = puVar18 + 2;
      }
      (t1->mqc).curctx = ppoVar14;
      (t1->mqc).c = OVar33;
      (t1->mqc).a = uVar9;
      (t1->mqc).ct = OVar22;
      if (uVar28 < uVar26) {
        for (uVar9 = 0; uVar9 != uVar29; uVar9 = uVar9 + 1) {
          uVar10 = 0;
          for (uVar31 = 0; uVar31 < t1->h - uVar28; uVar31 = uVar31 + 1) {
            opj_t1_dec_clnpass_step
                      (t1,puVar18,(OPJ_INT32 *)(local_88 + uVar10),uVar15,(OPJ_UINT32)uVar31,0);
            uVar10 = uVar10 + uVar29;
          }
          *puVar18 = *puVar18 & 0xb6dfffff;
          puVar18 = puVar18 + 1;
          local_88 = local_88 + 1;
        }
      }
    }
    else {
      for (uVar28 = 0; uVar26 = t1->h, uVar28 < (uVar26 & 0xfffffffc); uVar28 = uVar28 + 4) {
        for (uVar26 = 0; uVar26 != uVar29; uVar26 = uVar26 + 1) {
          uVar16 = *puVar18;
          uVar13 = (ulong)uVar16;
          OVar19 = 8;
          if (uVar13 == 0) {
            poVar17 = *ppoVar4;
            uVar16 = poVar17->qeval;
            uVar21 = uVar9 - uVar16;
            if (OVar33 >> 0x10 < uVar16) {
              uVar20 = poVar17->mps;
              *ppoVar4 = (&poVar17->nmps)[uVar16 <= uVar21];
              uVar9 = uVar16;
              do {
                if (OVar22 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x200;
                      OVar22 = 7;
                    }
                    else {
                      OVar33 = OVar33 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                      OVar22 = OVar19;
                    }
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar33 = OVar33 + (uint)bVar6 * 0x100;
                    OVar22 = OVar19;
                  }
                }
                uVar9 = uVar9 * 2;
                OVar33 = OVar33 * 2;
                OVar22 = OVar22 - 1;
              } while (uVar9 < 0x8000);
              uVar12 = (uint)(uVar20 == 0);
              if (uVar21 < uVar16) {
                uVar12 = uVar20;
              }
            }
            else {
              OVar33 = OVar33 + uVar16 * -0x10000;
              uVar9 = uVar21;
              if ((short)uVar21 < 0) {
                uVar12 = poVar17->mps;
              }
              else {
                uVar20 = poVar17->mps;
                *ppoVar4 = (&poVar17->nmps)[uVar21 < uVar16];
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar16 <= uVar21) {
                  uVar12 = uVar20;
                }
              }
            }
            ppoVar14 = ppoVar4;
            if (uVar12 != 0) {
              poVar17 = *ppoVar5;
              uVar16 = poVar17->qeval;
              uVar9 = uVar9 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                poVar17 = (&poVar17->nmps)[uVar16 <= uVar9];
                *ppoVar5 = poVar17;
                uVar21 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar21 = uVar21 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar21 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar9 < uVar16) {
                  uVar12 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar21 = uVar9;
                if ((short)uVar9 < 0) {
                  uVar12 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  poVar17 = (&poVar17->nmps)[uVar9 < uVar16];
                  *ppoVar5 = poVar17;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar21 = uVar21 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar21 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar9) {
                    uVar12 = uVar20;
                  }
                }
              }
              uVar16 = poVar17->qeval;
              uVar21 = uVar21 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                *ppoVar5 = (&poVar17->nmps)[uVar16 <= uVar21];
                uVar9 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar20 == 0);
                if (uVar21 < uVar16) {
                  uVar23 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar9 = uVar21;
                if ((short)uVar21 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  *ppoVar5 = (&poVar17->nmps)[uVar21 < uVar16];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar21) {
                    uVar23 = uVar20;
                  }
                }
              }
              OVar32 = 0;
              uVar16 = 0;
              ppoVar14 = ppoVar5;
              OVar11 = 0;
              switch(uVar12 * 2 | uVar23) {
              case 0:
                uVar21 = puVar18[1] >> 0x11 & 4 | puVar18[-1] >> 0x13 & 1;
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [uVar21];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar16 = poVar17->qeval;
                uVar9 = uVar9 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  OVar11 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar16 <= uVar9];
                  uVar20 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar20 = uVar20 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar20 < 0x8000);
                  OVar32 = (uint)(OVar11 == 0);
                  if (uVar9 < uVar16) {
                    OVar32 = OVar11;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar20 = uVar9;
                  if ((short)uVar9 < 0) {
                    OVar32 = poVar17->mps;
                  }
                  else {
                    OVar11 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar9 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar20 = uVar20 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar20 < 0x8000);
                    OVar32 = (uint)(OVar11 == 0);
                    if (uVar16 <= uVar9) {
                      OVar32 = OVar11;
                    }
                  }
                }
                bVar6 = ""[uVar21];
                uVar9 = uVar30;
                if (OVar32 == bVar6) {
                  uVar9 = uVar15;
                }
                *local_88 = uVar9;
                *(byte *)(puVar18 + -1) = (byte)puVar18[-1] | 0x20;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 8;
                bVar7 = (t1->mqc).lut_ctxno_zc_orient[2];
                poVar17 = (t1->mqc).ctxs[bVar7];
                uVar16 = poVar17->qeval;
                uVar20 = uVar20 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  uVar21 = poVar17->mps;
                  (t1->mqc).ctxs[bVar7] = (&poVar17->nmps)[uVar16 <= uVar20];
                  uVar9 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar7 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar7 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar7 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar7 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar12 = (uint)(uVar21 == 0);
                  if (uVar20 < uVar16) {
                    uVar12 = uVar21;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar9 = uVar20;
                  if ((short)uVar20 < 0) {
                    uVar12 = poVar17->mps;
                  }
                  else {
                    uVar21 = poVar17->mps;
                    (t1->mqc).ctxs[bVar7] = (&poVar17->nmps)[uVar20 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar7 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar7 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar7 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar7 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    uVar12 = (uint)(uVar21 == 0);
                    if (uVar16 <= uVar20) {
                      uVar12 = uVar21;
                    }
                  }
                }
                OVar32 = (OVar32 ^ bVar6) << 0x13 | 0x10;
                if (uVar12 != 0) goto switchD_0012ce4e_caseD_1;
                break;
              case 1:
switchD_0012ce4e_caseD_1:
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(OVar32,puVar18[-1],puVar18[1],1);
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [OVar11];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar16 = poVar17->qeval;
                uVar21 = uVar9 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  uVar20 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar16 <= uVar21];
                  uVar9 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar21 < uVar16) {
                    uVar12 = uVar20;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar9 = uVar21;
                  if ((short)uVar21 < 0) {
                    uVar12 = poVar17->mps;
                  }
                  else {
                    uVar20 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar21 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    uVar12 = (uint)(uVar20 == 0);
                    if (uVar16 <= uVar21) {
                      uVar12 = uVar20;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar16 = uVar30;
                if (uVar12 == bVar6) {
                  uVar16 = uVar15;
                }
                local_88[uVar31] = uVar16;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 1;
                OVar32 = OVar32 | (uVar12 ^ bVar6) << 0x16 | 0x80;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 0x40;
                break;
              case 2:
                goto switchD_0012ce4e_caseD_2;
              case 3:
                goto switchD_0012ce4e_caseD_3;
              default:
                goto switchD_0012ce4e_default;
              }
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[OVar32 >> 6 & 0x1ef];
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar16 = poVar17->qeval;
              uVar21 = uVar9 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar16 <= uVar21];
                uVar9 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar21 < uVar16) {
                  uVar12 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar9 = uVar21;
                if ((short)uVar21 < 0) {
                  uVar12 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar21 < uVar16];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar21) {
                    uVar12 = uVar20;
                  }
                }
              }
              uVar16 = OVar32;
              if (uVar12 != 0) {
switchD_0012ce4e_caseD_2:
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(OVar32,puVar18[-1],puVar18[1],2);
                bVar6 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                        [OVar11];
                poVar17 = (t1->mqc).ctxs[bVar6];
                uVar16 = poVar17->qeval;
                uVar21 = uVar9 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  uVar20 = poVar17->mps;
                  (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar16 <= uVar21];
                  uVar9 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar21 < uVar16) {
                    uVar12 = uVar20;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar9 = uVar21;
                  if ((short)uVar21 < 0) {
                    uVar12 = poVar17->mps;
                  }
                  else {
                    uVar20 = poVar17->mps;
                    (t1->mqc).ctxs[bVar6] = (&poVar17->nmps)[uVar21 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    uVar12 = (uint)(uVar20 == 0);
                    if (uVar16 <= uVar21) {
                      uVar12 = uVar20;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar16 = uVar30;
                if (uVar12 == bVar6) {
                  uVar16 = uVar15;
                }
                local_88[uVar25] = uVar16;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 8;
                *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 2;
                uVar16 = OVar32 | (uVar12 ^ bVar6) << 0x19 | 0x400;
              }
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar16 >> 9 & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (OVar33 >> 0x10 < uVar21) {
                uVar12 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                uVar9 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar12 == 0);
                if (uVar20 < uVar21) {
                  uVar23 = uVar12;
                }
              }
              else {
                OVar33 = OVar33 + uVar21 * -0x10000;
                uVar9 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
              }
              OVar11 = uVar16;
              if (uVar23 != 0) {
switchD_0012ce4e_caseD_3:
                uVar16 = OVar11;
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar16,puVar18[-1],puVar18[1],3);
                uVar13 = (ulong)OVar11;
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar13];
                poVar17 = *ppoVar14;
                uVar21 = poVar17->qeval;
                uVar20 = uVar9 - uVar21;
                if (OVar33 >> 0x10 < uVar21) {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                  uVar9 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  goto LAB_0012e134;
                }
                OVar33 = OVar33 + uVar21 * -0x10000;
                if ((short)uVar20 < 0) {
LAB_0012e1cd:
                  uVar9 = uVar20;
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                  uVar9 = uVar20;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
LAB_0012e1d9:
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
                goto LAB_0012e1e8;
              }
              goto switchD_0012ce4e_default;
            }
          }
          else {
            if ((uVar16 & 0x200010) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[uVar16 & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (OVar33 >> 0x10 < uVar21) {
                uVar12 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                uVar9 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar12 == 0);
                if (uVar20 < uVar21) {
                  uVar23 = uVar12;
                }
              }
              else {
                OVar33 = OVar33 + uVar21 * -0x10000;
                uVar9 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
              }
              if (uVar23 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar16,puVar18[-1],puVar18[1],0);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar21 = poVar17->qeval;
                uVar20 = uVar9 - uVar21;
                if (OVar33 >> 0x10 < uVar21) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                  uVar9 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar20 < uVar21) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar21 * -0x10000;
                  uVar9 = uVar20;
                  if ((short)uVar20 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar21 <= uVar20) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar21 = uVar30;
                if (OVar24 == bVar6) {
                  uVar21 = uVar15;
                }
                *local_88 = uVar21;
                *(byte *)(puVar18 + -1) = (byte)puVar18[-1] | 0x20;
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 8;
                uVar13 = (ulong)((OVar24 ^ bVar6) << 0x13 | uVar16 | 0x10);
              }
            }
            if ((uVar13 & 0x1000080) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 3) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar16 = poVar17->qeval;
              uVar21 = uVar9 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar16 <= uVar21];
                uVar9 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar21 < uVar16) {
                  uVar12 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar9 = uVar21;
                if ((short)uVar21 < 0) {
                  uVar12 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar21 < uVar16];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar21) {
                    uVar12 = uVar20;
                  }
                }
              }
              if (uVar12 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index((uint)uVar13,puVar18[-1],puVar18[1],1);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar16 = poVar17->qeval;
                uVar21 = uVar9 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar16 <= uVar21];
                  uVar9 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar21 < uVar16) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar9 = uVar21;
                  if ((short)uVar21 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar21 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar16 <= uVar21) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar16 = uVar30;
                if (OVar24 == bVar6) {
                  uVar16 = uVar15;
                }
                local_88[uVar31] = uVar16;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 1;
                uVar13 = (ulong)((uint)uVar13 | (OVar24 ^ bVar6) << 0x16 | 0x80);
                *(byte *)(puVar18 + 1) = (byte)puVar18[1] | 0x40;
              }
            }
            if ((uVar13 & 0x8000400) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 6) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar16 = poVar17->qeval;
              uVar21 = uVar9 - uVar16;
              if (OVar33 >> 0x10 < uVar16) {
                uVar20 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar16 <= uVar21];
                uVar9 = uVar16;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar12 = (uint)(uVar20 == 0);
                if (uVar21 < uVar16) {
                  uVar12 = uVar20;
                }
              }
              else {
                OVar33 = OVar33 + uVar16 * -0x10000;
                uVar9 = uVar21;
                if ((short)uVar21 < 0) {
                  uVar12 = poVar17->mps;
                }
                else {
                  uVar20 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar21 < uVar16];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar12 = (uint)(uVar20 == 0);
                  if (uVar16 <= uVar21) {
                    uVar12 = uVar20;
                  }
                }
              }
              if (uVar12 != 0) {
                OVar11 = opj_t1_getctxtno_sc_or_spb_index((uint)uVar13,puVar18[-1],puVar18[1],2);
                ppoVar14 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [OVar11];
                poVar17 = *ppoVar14;
                uVar16 = poVar17->qeval;
                uVar21 = uVar9 - uVar16;
                if (OVar33 >> 0x10 < uVar16) {
                  OVar32 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar16 <= uVar21];
                  uVar9 = uVar16;
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  OVar24 = (uint)(OVar32 == 0);
                  if (uVar21 < uVar16) {
                    OVar24 = OVar32;
                  }
                }
                else {
                  OVar33 = OVar33 + uVar16 * -0x10000;
                  uVar9 = uVar21;
                  if ((short)uVar21 < 0) {
                    OVar24 = poVar17->mps;
                  }
                  else {
                    OVar32 = poVar17->mps;
                    *ppoVar14 = (&poVar17->nmps)[uVar21 < uVar16];
                    do {
                      if (OVar22 == 0) {
                        pOVar8 = *ppOVar1;
                        bVar6 = pOVar8[1];
                        if (*pOVar8 == 0xff) {
                          if (bVar6 < 0x90) {
                            *ppOVar1 = pOVar8 + 1;
                            OVar33 = OVar33 + (uint)bVar6 * 0x200;
                            OVar22 = 7;
                          }
                          else {
                            OVar33 = OVar33 + 0xff00;
                            *pOVar2 = *pOVar2 + 1;
                            OVar22 = OVar19;
                          }
                        }
                        else {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x100;
                          OVar22 = OVar19;
                        }
                      }
                      uVar9 = uVar9 * 2;
                      OVar33 = OVar33 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar9 < 0x8000);
                    OVar24 = (uint)(OVar32 == 0);
                    if (uVar16 <= uVar21) {
                      OVar24 = OVar32;
                    }
                  }
                }
                bVar6 = ""[OVar11];
                uVar16 = uVar30;
                if (OVar24 == bVar6) {
                  uVar16 = uVar15;
                }
                local_88[uVar25] = uVar16;
                *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 8;
                uVar13 = (ulong)((uint)uVar13 | (OVar24 ^ bVar6) << 0x19 | 0x400);
                *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 2;
              }
            }
            uVar16 = (uint)uVar13;
            if ((uVar13 & 0x40002000) == 0) {
              bVar6 = (t1->mqc).lut_ctxno_zc_orient[(uint)(uVar13 >> 9) & 0x1ef];
              ppoVar14 = (t1->mqc).ctxs + bVar6;
              poVar17 = (t1->mqc).ctxs[bVar6];
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (OVar33 >> 0x10 < uVar21) {
                uVar12 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
                uVar9 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                uVar23 = (uint)(uVar12 == 0);
                if (uVar20 < uVar21) {
                  uVar23 = uVar12;
                }
              }
              else {
                OVar33 = OVar33 + uVar21 * -0x10000;
                uVar9 = uVar20;
                if ((short)uVar20 < 0) {
                  uVar23 = poVar17->mps;
                }
                else {
                  uVar12 = poVar17->mps;
                  *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar8 = *ppOVar1;
                      bVar6 = pOVar8[1];
                      if (*pOVar8 == 0xff) {
                        if (bVar6 < 0x90) {
                          *ppOVar1 = pOVar8 + 1;
                          OVar33 = OVar33 + (uint)bVar6 * 0x200;
                          OVar22 = 7;
                        }
                        else {
                          OVar33 = OVar33 + 0xff00;
                          *pOVar2 = *pOVar2 + 1;
                          OVar22 = OVar19;
                        }
                      }
                      else {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x100;
                        OVar22 = OVar19;
                      }
                    }
                    uVar9 = uVar9 * 2;
                    OVar33 = OVar33 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar9 < 0x8000);
                  uVar23 = (uint)(uVar12 == 0);
                  if (uVar21 <= uVar20) {
                    uVar23 = uVar12;
                  }
                }
              }
              if (uVar23 == 0) goto switchD_0012ce4e_default;
              OVar11 = opj_t1_getctxtno_sc_or_spb_index(uVar16,puVar18[-1],puVar18[1],3);
              uVar13 = (ulong)OVar11;
              ppoVar14 = (t1->mqc).ctxs +
                         "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                         [uVar13];
              poVar17 = *ppoVar14;
              uVar21 = poVar17->qeval;
              uVar20 = uVar9 - uVar21;
              if (uVar21 <= OVar33 >> 0x10) {
                OVar33 = OVar33 + uVar21 * -0x10000;
                if ((short)uVar20 < 0) goto LAB_0012e1cd;
                uVar12 = poVar17->mps;
                *ppoVar14 = (&poVar17->nmps)[uVar20 < uVar21];
                uVar9 = uVar20;
                do {
                  if (OVar22 == 0) {
                    pOVar8 = *ppOVar1;
                    bVar6 = pOVar8[1];
                    if (*pOVar8 == 0xff) {
                      if (bVar6 < 0x90) {
                        *ppOVar1 = pOVar8 + 1;
                        OVar33 = OVar33 + (uint)bVar6 * 0x200;
                        OVar22 = 7;
                      }
                      else {
                        OVar33 = OVar33 + 0xff00;
                        *pOVar2 = *pOVar2 + 1;
                        OVar22 = OVar19;
                      }
                    }
                    else {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x100;
                      OVar22 = OVar19;
                    }
                  }
                  uVar9 = uVar9 * 2;
                  OVar33 = OVar33 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar9 < 0x8000);
                goto LAB_0012e1d9;
              }
              uVar12 = poVar17->mps;
              *ppoVar14 = (&poVar17->nmps)[uVar21 <= uVar20];
              uVar9 = uVar21;
              do {
                if (OVar22 == 0) {
                  pOVar8 = *ppOVar1;
                  bVar6 = pOVar8[1];
                  if (*pOVar8 == 0xff) {
                    if (bVar6 < 0x90) {
                      *ppOVar1 = pOVar8 + 1;
                      OVar33 = OVar33 + (uint)bVar6 * 0x200;
                      OVar22 = 7;
                    }
                    else {
                      OVar33 = OVar33 + 0xff00;
                      *pOVar2 = *pOVar2 + 1;
                      OVar22 = OVar19;
                    }
                  }
                  else {
                    *ppOVar1 = pOVar8 + 1;
                    OVar33 = OVar33 + (uint)bVar6 * 0x100;
                    OVar22 = OVar19;
                  }
                }
                uVar9 = uVar9 * 2;
                OVar33 = OVar33 * 2;
                OVar22 = OVar22 - 1;
              } while (uVar9 < 0x8000);
LAB_0012e134:
              uVar23 = (uint)(uVar12 == 0);
              if (uVar20 < uVar21) {
                uVar23 = uVar12;
              }
LAB_0012e1e8:
              uVar20 = uVar23 ^ ""[uVar13];
              uVar21 = uVar30;
              if (uVar23 == ""[uVar13]) {
                uVar21 = uVar15;
              }
              local_88[uVar10] = uVar21;
              *(byte *)((long)puVar18 + -3) = *(byte *)((long)puVar18 + -3) | 0x40;
              *(byte *)((long)puVar18 + 5) = *(byte *)((long)puVar18 + 5) | 0x10;
              uVar13 = (ulong)(t1->w + 2);
              *(ulong *)(puVar18 + (uVar13 - 1)) =
                   CONCAT44(uVar20 << 0x12,4) | 0x200000000 | *(ulong *)(puVar18 + (uVar13 - 1));
              *(byte *)(puVar18 + uVar13 + 1) = (byte)puVar18[uVar13 + 1] | 1;
              uVar16 = uVar20 << 0x1c | uVar16 | 0x2000;
            }
switchD_0012ce4e_default:
            *puVar18 = uVar16 & 0xb6dfffff;
          }
          local_88 = local_88 + 1;
          puVar18 = puVar18 + 1;
        }
        local_88 = local_88 + uVar10;
        puVar18 = puVar18 + 2;
      }
      (t1->mqc).curctx = ppoVar14;
      (t1->mqc).c = OVar33;
      (t1->mqc).a = uVar9;
      (t1->mqc).ct = OVar22;
      if (uVar28 < uVar26) {
        for (uVar9 = 0; uVar9 != uVar29; uVar9 = uVar9 + 1) {
          uVar10 = 0;
          for (uVar31 = 0; uVar31 < t1->h - uVar28; uVar31 = uVar31 + 1) {
            opj_t1_dec_clnpass_step
                      (t1,puVar18,(OPJ_INT32 *)(local_88 + uVar10),uVar15,(OPJ_UINT32)uVar31,1);
            uVar10 = uVar10 + uVar29;
          }
          *puVar18 = *puVar18 & 0xb6dfffff;
          puVar18 = puVar18 + 1;
          local_88 = local_88 + 1;
        }
      }
    }
  }
  if ((cblksty & 0x20U) != 0) {
    (t1->mqc).curctx = (t1->mqc).ctxs + 0x12;
    poVar17 = (t1->mqc).ctxs[0x12];
    uVar29 = poVar17->qeval;
    uVar9 = (t1->mqc).c;
    uVar10 = (t1->mqc).a - uVar29;
    (t1->mqc).a = uVar10;
    if (uVar9 >> 0x10 < uVar29) {
      (t1->mqc).a = uVar29;
      poVar17 = (&poVar17->nmps)[uVar29 <= uVar10];
      (t1->mqc).ctxs[0x12] = poVar17;
      OVar33 = (t1->mqc).ct;
      do {
        if (OVar33 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar9 = uVar9 + (uint)bVar6 * 0x200;
              OVar33 = 7;
              goto LAB_0012ff2b;
            }
            uVar9 = uVar9 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar9 = uVar9 + (uint)bVar6 * 0x100;
          }
          OVar33 = 8;
        }
LAB_0012ff2b:
        uVar29 = uVar29 * 2;
        (t1->mqc).a = uVar29;
        uVar9 = uVar9 * 2;
        (t1->mqc).c = uVar9;
        OVar33 = OVar33 - 1;
        (t1->mqc).ct = OVar33;
        uVar10 = uVar29;
      } while (uVar29 < 0x8000);
    }
    else {
      uVar9 = uVar9 + uVar29 * -0x10000;
      (t1->mqc).c = uVar9;
      if (-1 < (short)uVar10) {
        poVar17 = (&poVar17->nmps)[uVar10 < uVar29];
        (t1->mqc).ctxs[0x12] = poVar17;
        OVar33 = (t1->mqc).ct;
        do {
          if (OVar33 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                uVar9 = uVar9 + (uint)bVar6 * 0x200;
                OVar33 = 7;
                goto LAB_0012ffc2;
              }
              uVar9 = uVar9 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              uVar9 = uVar9 + (uint)bVar6 * 0x100;
            }
            OVar33 = 8;
          }
LAB_0012ffc2:
          uVar10 = uVar10 * 2;
          (t1->mqc).a = uVar10;
          uVar9 = uVar9 * 2;
          (t1->mqc).c = uVar9;
          OVar33 = OVar33 - 1;
          (t1->mqc).ct = OVar33;
        } while (uVar10 < 0x8000);
      }
    }
    uVar29 = poVar17->qeval;
    uVar10 = uVar10 - uVar29;
    (t1->mqc).a = uVar10;
    if (uVar9 >> 0x10 < uVar29) {
      (t1->mqc).a = uVar29;
      poVar17 = (&poVar17->nmps)[uVar29 <= uVar10];
      (t1->mqc).ctxs[0x12] = poVar17;
      OVar33 = (t1->mqc).ct;
      do {
        if (OVar33 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar9 = uVar9 + (uint)bVar6 * 0x200;
              OVar33 = 7;
              goto LAB_0013005e;
            }
            uVar9 = uVar9 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar9 = uVar9 + (uint)bVar6 * 0x100;
          }
          OVar33 = 8;
        }
LAB_0013005e:
        uVar29 = uVar29 * 2;
        (t1->mqc).a = uVar29;
        uVar9 = uVar9 * 2;
        (t1->mqc).c = uVar9;
        OVar33 = OVar33 - 1;
        (t1->mqc).ct = OVar33;
        uVar10 = uVar29;
      } while (uVar29 < 0x8000);
    }
    else {
      uVar9 = uVar9 + uVar29 * -0x10000;
      (t1->mqc).c = uVar9;
      if (-1 < (short)uVar10) {
        poVar17 = (&poVar17->nmps)[uVar10 < uVar29];
        (t1->mqc).ctxs[0x12] = poVar17;
        OVar33 = (t1->mqc).ct;
        do {
          if (OVar33 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                uVar9 = uVar9 + (uint)bVar6 * 0x200;
                OVar33 = 7;
                goto LAB_001300f5;
              }
              uVar9 = uVar9 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              uVar9 = uVar9 + (uint)bVar6 * 0x100;
            }
            OVar33 = 8;
          }
LAB_001300f5:
          uVar10 = uVar10 * 2;
          (t1->mqc).a = uVar10;
          uVar9 = uVar9 * 2;
          (t1->mqc).c = uVar9;
          OVar33 = OVar33 - 1;
          (t1->mqc).ct = OVar33;
        } while (uVar10 < 0x8000);
      }
    }
    uVar29 = poVar17->qeval;
    uVar10 = uVar10 - uVar29;
    (t1->mqc).a = uVar10;
    if (uVar9 >> 0x10 < uVar29) {
      (t1->mqc).a = uVar29;
      poVar17 = (&poVar17->nmps)[uVar29 <= uVar10];
      (t1->mqc).ctxs[0x12] = poVar17;
      OVar33 = (t1->mqc).ct;
      do {
        if (OVar33 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar9 = uVar9 + (uint)bVar6 * 0x200;
              OVar33 = 7;
              goto LAB_00130191;
            }
            uVar9 = uVar9 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar9 = uVar9 + (uint)bVar6 * 0x100;
          }
          OVar33 = 8;
        }
LAB_00130191:
        uVar29 = uVar29 * 2;
        (t1->mqc).a = uVar29;
        uVar9 = uVar9 * 2;
        (t1->mqc).c = uVar9;
        OVar33 = OVar33 - 1;
        (t1->mqc).ct = OVar33;
        uVar10 = uVar29;
      } while (uVar29 < 0x8000);
    }
    else {
      uVar9 = uVar9 + uVar29 * -0x10000;
      (t1->mqc).c = uVar9;
      if (-1 < (short)uVar10) {
        poVar17 = (&poVar17->nmps)[uVar10 < uVar29];
        (t1->mqc).ctxs[0x12] = poVar17;
        OVar33 = (t1->mqc).ct;
        do {
          if (OVar33 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                uVar9 = uVar9 + (uint)bVar6 * 0x200;
                OVar33 = 7;
                goto LAB_00130228;
              }
              uVar9 = uVar9 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              uVar9 = uVar9 + (uint)bVar6 * 0x100;
            }
            OVar33 = 8;
          }
LAB_00130228:
          uVar10 = uVar10 * 2;
          (t1->mqc).a = uVar10;
          uVar9 = uVar9 * 2;
          (t1->mqc).c = uVar9;
          OVar33 = OVar33 - 1;
          (t1->mqc).ct = OVar33;
        } while (uVar10 < 0x8000);
      }
    }
    uVar29 = poVar17->qeval;
    uVar10 = uVar10 - uVar29;
    (t1->mqc).a = uVar10;
    if (uVar9 >> 0x10 < uVar29) {
      (t1->mqc).a = uVar29;
      (t1->mqc).ctxs[0x12] = (&poVar17->nmps)[uVar29 <= uVar10];
      OVar33 = (t1->mqc).ct;
      do {
        if (OVar33 == 0) {
          pOVar8 = (t1->mqc).bp;
          bVar6 = pOVar8[1];
          if (*pOVar8 == 0xff) {
            if (bVar6 < 0x90) {
              (t1->mqc).bp = pOVar8 + 1;
              uVar9 = uVar9 + (uint)bVar6 * 0x200;
              OVar33 = 7;
              goto LAB_001302c0;
            }
            uVar9 = uVar9 + 0xff00;
            pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar2 = *pOVar2 + 1;
          }
          else {
            (t1->mqc).bp = pOVar8 + 1;
            uVar9 = uVar9 + (uint)bVar6 * 0x100;
          }
          OVar33 = 8;
        }
LAB_001302c0:
        uVar29 = uVar29 * 2;
        (t1->mqc).a = uVar29;
        uVar9 = uVar9 * 2;
        (t1->mqc).c = uVar9;
        OVar33 = OVar33 - 1;
        (t1->mqc).ct = OVar33;
      } while (uVar29 < 0x8000);
    }
    else {
      OVar33 = uVar9 + uVar29 * -0x10000;
      (t1->mqc).c = OVar33;
      if (-1 < (short)uVar10) {
        (t1->mqc).ctxs[0x12] = (&poVar17->nmps)[uVar10 < uVar29];
        OVar22 = (t1->mqc).ct;
        do {
          if (OVar22 == 0) {
            pOVar8 = (t1->mqc).bp;
            bVar6 = pOVar8[1];
            if (*pOVar8 == 0xff) {
              if (bVar6 < 0x90) {
                (t1->mqc).bp = pOVar8 + 1;
                OVar33 = OVar33 + (uint)bVar6 * 0x200;
                OVar22 = 7;
                goto LAB_0013034f;
              }
              OVar33 = OVar33 + 0xff00;
              pOVar2 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar2 = *pOVar2 + 1;
            }
            else {
              (t1->mqc).bp = pOVar8 + 1;
              OVar33 = OVar33 + (uint)bVar6 * 0x100;
            }
            OVar22 = 8;
          }
LAB_0013034f:
          uVar10 = uVar10 * 2;
          (t1->mqc).a = uVar10;
          OVar33 = OVar33 * 2;
          (t1->mqc).c = OVar33;
          OVar22 = OVar22 - 1;
          (t1->mqc).ct = OVar22;
        } while (uVar10 < 0x8000);
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_clnpass(
    opj_t1_t *t1,
    OPJ_INT32 bpno,
    OPJ_INT32 cblksty)
{
    if (t1->w == 64 && t1->h == 64) {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_64x64_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_64x64_novsc(t1, bpno);
        }
    } else {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_clnpass_generic_vsc(t1, bpno);
        } else {
            opj_t1_dec_clnpass_generic_novsc(t1, bpno);
        }
    }
    opj_t1_dec_clnpass_check_segsym(t1, cblksty);
}